

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong __thiscall mkvparser::Cluster::GetFirstTime(Cluster *this)

{
  Block *this_00;
  Block *pBlock;
  long status;
  BlockEntry *pEntry;
  Cluster *this_local;
  
  pEntry = (BlockEntry *)this;
  this_local = (Cluster *)GetFirst(this,(BlockEntry **)&status);
  if (-1 < (long)this_local) {
    if (status == 0) {
      this_local = (Cluster *)GetTime(this);
    }
    else {
      this_00 = (Block *)(**(code **)(*(long *)status + 0x10))();
      if (this_00 == (Block *)0x0) {
        __assert_fail("pBlock",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1bde,"long long mkvparser::Cluster::GetFirstTime() const");
      }
      this_local = (Cluster *)Block::GetTime(this_00,this);
    }
  }
  return (longlong)this_local;
}

Assistant:

long long Cluster::GetFirstTime() const {
  const BlockEntry* pEntry;

  const long status = GetFirst(pEntry);

  if (status < 0)  // error
    return status;

  if (pEntry == NULL)  // empty cluster
    return GetTime();

  const Block* const pBlock = pEntry->GetBlock();
  assert(pBlock);

  return pBlock->GetTime(this);
}